

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O1

bool __thiscall
RoboClaw::GetPinFunctions(RoboClaw *this,uint8_t *S3mode,uint8_t *S4mode,uint8_t *S5mode)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  short sVar4;
  uint uVar5;
  ssize_t sVar6;
  ssize_t sVar7;
  ssize_t sVar8;
  ssize_t sVar9;
  ssize_t sVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  void *__buf;
  uint8_t trys;
  char cVar14;
  bool bVar15;
  
  cVar14 = '\x02';
  while( true ) {
    (*this->_vptr_RoboClaw[1])(this);
    this->m_crc = 0;
    (**this->_vptr_RoboClaw)(this,(ulong)this->m_address);
    uVar3 = (ushort)(*(int *)&this->m_address << 8) ^ this->m_crc;
    this->m_crc = uVar3;
    iVar11 = 8;
    do {
      uVar1 = uVar3 * 2;
      bVar15 = -1 < (short)uVar3;
      uVar3 = uVar1 ^ 0x1021;
      if (bVar15) {
        uVar3 = uVar1;
      }
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    this->m_crc = uVar3;
    (**this->_vptr_RoboClaw)(this,0x4b);
    uVar5 = *(uint *)&this->m_crc ^ 0x4b00;
    this->m_crc = (uint16_t)uVar5;
    uVar13 = 8;
    do {
      uVar2 = uVar5 * 2;
      sVar4 = (short)uVar5;
      uVar5 = uVar2 ^ 0x1021;
      if (-1 < sVar4) {
        uVar5 = uVar2;
      }
      uVar12 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar12;
    } while (uVar12 != 0);
    this->m_crc = (uint16_t)uVar5;
    sVar6 = read(this,this->m_timeout,(void *)(ulong)uVar2,uVar13);
    uVar3 = (ushort)(((uint)sVar6 & 0xff) << 8) ^ this->m_crc;
    uVar5 = (uint)uVar3;
    this->m_crc = uVar3;
    uVar13 = 8;
    do {
      uVar2 = uVar5 * 2;
      sVar4 = (short)uVar5;
      uVar5 = uVar2 ^ 0x1021;
      if (-1 < sVar4) {
        uVar5 = uVar2;
      }
      uVar12 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar12;
    } while (uVar12 != 0);
    this->m_crc = (uint16_t)uVar5;
    sVar7 = read(this,this->m_timeout,(void *)(ulong)uVar2,uVar13);
    uVar3 = (ushort)(((uint)sVar7 & 0xff) << 8) ^ this->m_crc;
    uVar5 = (uint)uVar3;
    this->m_crc = uVar3;
    uVar13 = 8;
    do {
      uVar2 = uVar5 * 2;
      sVar4 = (short)uVar5;
      uVar5 = uVar2 ^ 0x1021;
      if (-1 < sVar4) {
        uVar5 = uVar2;
      }
      uVar12 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar12;
    } while (uVar12 != 0);
    this->m_crc = (uint16_t)uVar5;
    sVar8 = read(this,this->m_timeout,(void *)(ulong)uVar2,uVar13);
    uVar3 = (ushort)(((uint)sVar8 & 0xff) << 8) ^ this->m_crc;
    uVar5 = (uint)uVar3;
    this->m_crc = uVar3;
    uVar13 = 8;
    do {
      uVar2 = uVar5 * 2;
      sVar4 = (short)uVar5;
      uVar5 = uVar2 ^ 0x1021;
      if (-1 < sVar4) {
        uVar5 = uVar2;
      }
      uVar12 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar12;
    } while (uVar12 != 0);
    this->m_crc = (uint16_t)uVar5;
    sVar9 = read(this,this->m_timeout,(void *)(ulong)uVar2,uVar13);
    sVar10 = read(this,this->m_timeout,__buf,uVar13);
    uVar5 = ((uint)sVar9 & 0xff) << 8 | (uint)sVar10 & 0xff;
    uVar3 = this->m_crc;
    if (uVar5 == uVar3) break;
    bVar15 = cVar14 == '\0';
    cVar14 = cVar14 + -1;
    if (bVar15) {
LAB_00107938:
      return uVar5 == uVar3;
    }
  }
  *S3mode = (uint8_t)sVar6;
  *S4mode = (uint8_t)sVar7;
  *S5mode = (uint8_t)sVar8;
  goto LAB_00107938;
}

Assistant:

bool RoboClaw::GetPinFunctions( uint8_t &S3mode, uint8_t &S4mode, uint8_t &S5mode)
{
    uint8_t crc;
    bool valid = false;
    uint8_t val1,val2,val3;
    uint8_t trys=MAXRETRY;
    int16_t data;
    do{
        flush();

        crc_clear();
        write( m_address);
        crc_update( m_address );
        write(GETPINFUNCTIONS);
        crc_update(GETPINFUNCTIONS);

        data = read( m_timeout );
        crc_update(data);
        val1=data;

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            val2=data;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            val3=data;
        }

        if( data != -1 )
        {
            uint16_t ccrc;
            data = read( m_timeout );
            if( data != -1 )
            {
                ccrc = data << 8;
                data = read( m_timeout );
                if( data != -1 )
                {
                    ccrc |= data;
                    if(crc_get()==ccrc)
                    {
                        S3mode = val1;
                        S4mode = val2;
                        S5mode = val3;
                        return true;
                    }
                }
            }
        }
    }while(trys--);

    return false;
}